

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::bcd<(moira::Core)1,(moira::Instr)101,1>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  ushort uVar2;
  u32 uVar3;
  ulong uVar4;
  bool local_41;
  u16 hi;
  u16 lo;
  u16 lo2;
  u16 hi2;
  u16 lo1;
  u16 hi1;
  u64 result;
  u64 tmp;
  u32 op2_local;
  u32 op1_local;
  Moira *this_local;
  
  uVar2 = (((ushort)op2 & 0xf) - ((ushort)op1 & 0xf)) - (ushort)((this->reg).sr.x & 1);
  uVar4 = (ulong)(int)((uint)(ushort)(((ushort)op2 & 0xf0) - ((ushort)op1 & 0xf0)) + (uint)uVar2);
  if ((uVar2 & 0xf0) == 0) {
    (this->reg).sr.x = 0xff < ((op2 - op1) - (uint)((this->reg).sr.x & 1) & 0x300);
    _lo2 = uVar4;
  }
  else {
    (this->reg).sr.x = 0xff < (((op2 - op1) + -6) - (uint)((this->reg).sr.x & 1) & 0x300);
    _lo2 = uVar4 - 6;
  }
  if (0xff < ((op2 - op1) - (uint)((this->reg).sr.x & 1) & 0x100)) {
    _lo2 = _lo2 - 0x60;
  }
  local_41 = (uVar4 & 0x80) == 0x80 && (_lo2 & 0x80) == 0;
  (this->reg).sr.v = local_41;
  (this->reg).sr.c = (bool)((this->reg).sr.x & 1);
  bVar1 = NBIT<1>(_lo2);
  (this->reg).sr.n = bVar1;
  uVar3 = CLIP<1>(_lo2);
  if (uVar3 != 0) {
    (this->reg).sr.z = false;
  }
  return (u32)_lo2;
}

Assistant:

u32
Moira::bcd(u32 op1, u32 op2)
{
    u64 tmp, result;

    // Extract digits
    u16 hi1 = op1 & 0xF0, lo1 = op1 & 0x0F;
    u16 hi2 = op2 & 0xF0, lo2 = op2 & 0x0F;

    switch (I) {

        case Instr::ABCD:
        case Instr::ABCD_LOOP:
        {
            // Add digits
            u16 lo = lo1 + lo2 + reg.sr.x;
            u16 hi = hi1 + hi2;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo > 9) {
                result += 0x06;
            }

            // Rectify second digit
            if ((result & 0x3F0) > 0x90) {
                result += 0x60;
                reg.sr.x = 1;
            } else {
                reg.sr.x = 0;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0) && ((result & 0x80) == 0x80);
            } else {
                reg.sr.v = 0;
            }

            break;
        }
        case Instr::SBCD:
        case Instr::SBCD_LOOP:
        {
            // Subtract digits
            u16 lo = lo2 - lo1 - reg.sr.x;
            u16 hi = hi2 - hi1;
            result = tmp = hi + lo;

            // Rectify first digit
            if (lo & 0xF0) {
                result -= 0x06;
                reg.sr.x = ((op2 - op1 - 6 - reg.sr.x) & 0x300) > 0xFF;
            } else {
                reg.sr.x = ((op2 - op1 - reg.sr.x) & 0x300) > 0xFF;
            }

            // Rectify second digit
            if (((op2 - op1 - reg.sr.x) & 0x100) > 0xFF) {
                result -= 0x60;
            }

            // Set V flag
            if constexpr (C != Core::C68020) {
                reg.sr.v = ((tmp & 0x80) == 0x80) && ((result & 0x80) == 0);
            } else {
                reg.sr.v = 0;
            }

            break;
        }

        default:
            fatalError;
    }

    // Set other flags
    reg.sr.c = reg.sr.x;
    reg.sr.n = NBIT<S>(result);
    if (CLIP<Byte>(result)) reg.sr.z = 0;

    return (u32)result;
}